

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::Matcher
          (Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *this,
          not_null<const_pstore::command_line::option_*> *value)

{
  ComparisonBase<testing::internal::EqMatcher<pstore::gsl::not_null<const_pstore::command_line::option_*>_>,_pstore::gsl::not_null<const_pstore::command_line::option_*>,_testing::internal::AnyEq>
  local_38;
  Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> local_30;
  not_null<const_pstore::command_line::option_*> *local_18;
  not_null<const_pstore::command_line::option_*> *value_local;
  Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *this_local;
  
  local_18 = value;
  value_local = (not_null<const_pstore::command_line::option_*> *)this;
  internal::MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::
  MatcherBase(&this->
               super_MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>
             );
  (this->super_MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_00246d80;
  local_38.rhs_.ptr_ =
       (not_null<const_pstore::command_line::option_*>)
       Eq<pstore::gsl::not_null<pstore::command_line::option_const*>>(local_18->ptr_);
  Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&>::
  Matcher<testing::internal::EqMatcher<pstore::gsl::not_null<pstore::command_line::option_const*>>,void>
            ((Matcher<pstore::gsl::not_null<pstore::command_line::option_const*>const&> *)&local_30,
             (EqMatcher<pstore::gsl::not_null<const_pstore::command_line::option_*>_> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }